

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O2

void anon_unknown.dwarf_a9832::getRandTRS(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  int j;
  long lVar1;
  double dVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined8 local_58;
  float local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  dVar2 = Imath_3_2::Rand48::nextf(random,-10.0,10.0);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar2;
  local_38._12_4_ = extraout_XMM0_Dd;
  dVar2 = Imath_3_2::Rand48::nextf(random,-10.0,10.0);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = dVar2;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  dVar2 = Imath_3_2::Rand48::nextf(random,-10.0,10.0);
  trans->x = (float)(double)local_38._0_8_;
  trans->y = (float)(double)local_48._0_8_;
  trans->z = (float)dVar2;
  dVar2 = Imath_3_2::Rand48::nextf(random,-180.0,180.0);
  local_38._8_4_ = extraout_XMM0_Dc_01;
  local_38._0_8_ = dVar2;
  local_38._12_4_ = extraout_XMM0_Dd_01;
  dVar2 = Imath_3_2::Rand48::nextf(random,-180.0,180.0);
  local_48._8_4_ = extraout_XMM0_Dc_02;
  local_48._0_8_ = dVar2;
  local_48._12_4_ = extraout_XMM0_Dd_02;
  dVar2 = Imath_3_2::Rand48::nextf(random,-180.0,180.0);
  rot->x = (float)(double)local_38._0_8_ * 0.017453292;
  rot->y = (float)(double)local_48._0_8_ * 0.017453292;
  rot->z = (float)dVar2 * 0.017453292;
  dVar2 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  local_38._8_4_ = extraout_XMM0_Dc_03;
  local_38._0_8_ = dVar2;
  local_38._12_4_ = extraout_XMM0_Dd_03;
  dVar2 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  local_48._8_4_ = extraout_XMM0_Dc_04;
  local_48._0_8_ = dVar2;
  local_48._12_4_ = extraout_XMM0_Dd_04;
  dVar2 = Imath_3_2::Rand48::nextf(random,1e-06,2.0);
  local_50 = (float)dVar2;
  local_58 = CONCAT44((float)(double)local_48._0_8_,(float)(double)local_38._0_8_);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar2 = (double)Imath_3_2::erand48(random->_state);
    if (0.5 <= (1.0 - dVar2) * 0.0 + dVar2) {
      *(uint *)((long)&local_58 + lVar1 * 4) = *(uint *)((long)&local_58 + lVar1 * 4) ^ 0x80000000;
    }
  }
  scale->x = (float)(undefined4)local_58;
  scale->y = (float)local_58._4_4_;
  scale->z = local_50;
  return;
}

Assistant:

void
getRandTRS (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    // Translate
    trans = V3f (
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)),
            float(random.nextf (-10, 10)));
    // Rotate
    rot = V3f (
        rad (float(random.nextf (-180, 180))),
        rad (float(random.nextf (-180, 180))),
        rad (float(random.nextf (-180, 180))));

    // Scale
    V3f s (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));
    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) s[j] *= -1;
    scale = s;
}